

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ObjPrintEqn(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  int iVar1;
  Vec_Ptr_t *vSuper;
  void *pvVar2;
  char *pcVar3;
  Hop_Obj_t *pObj_00;
  
  pObj_00 = (Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  iVar1 = Hop_ObjIsConst1(pObj_00);
  if (iVar1 != 0) {
    fprintf((FILE *)pFile,"%d",(ulong)((uint)pObj & 1 ^ 1));
    return;
  }
  if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
    pcVar3 = "!";
    if (((ulong)pObj & 1) == 0) {
      pcVar3 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar3,(pObj_00->field_0).pData);
    return;
  }
  Vec_VecExpand(vLevels,Level);
  vSuper = Vec_VecEntry(vLevels,Level);
  Hop_ObjCollectMulti(pObj_00,vSuper);
  pcVar3 = "(";
  if (Level == 0) {
    pcVar3 = "";
  }
  fputs(pcVar3,(FILE *)pFile);
  pcVar3 = "+";
  if (((ulong)pObj & 1) == 0) {
    pcVar3 = "*";
  }
  for (iVar1 = 0; iVar1 < vSuper->nSize; iVar1 = iVar1 + 1) {
    pvVar2 = Vec_PtrEntry(vSuper,iVar1);
    Hop_ObjPrintEqn(pFile,(Hop_Obj_t *)((ulong)pvVar2 ^ (ulong)((uint)pObj & 1)),vLevels,Level + 1);
    if (iVar1 < vSuper->nSize + -1) {
      fprintf((FILE *)pFile," %s ",pcVar3);
    }
  }
  pcVar3 = ")";
  if (Level == 0) {
    pcVar3 = "";
  }
  fputs(pcVar3,(FILE *)pFile);
  return;
}

Assistant:

void Hop_ObjPrintEqn( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "!" : "", (char*)pObj->pData );
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintEqn( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "+" : "*" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}